

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

double Js::JavascriptNumber::DirectPow(double x,double y)

{
  bool bVar1;
  uint32 *puVar2;
  int32 local_24;
  double dStack_20;
  int32 intY;
  double y_local;
  double x_local;
  
  if ((y != 1.0) || (x_local = x, NAN(y))) {
    dStack_20 = y;
    y_local = x;
    puVar2 = NumberUtilities::LuLoDbl(&stack0xffffffffffffffe0);
    if ((*puVar2 == 0) &&
       (puVar2 = NumberUtilities::LuHiDbl(&stack0xffffffffffffffe0), (*puVar2 & 0x7fffffff) == 0)) {
      x_local = 1.0;
    }
    else if (((ABS(y_local) != 1.0) || (NAN(ABS(y_local)))) ||
            (bVar1 = NumberUtilities::IsFinite(dStack_20), bVar1)) {
      bVar1 = TryGetInt32Value<false>(dStack_20,&local_24);
      if (bVar1) {
        x_local = DirectPowDoubleInt(y_local,local_24);
      }
      else {
        x_local = pow(y_local,dStack_20);
      }
    }
    else {
      x_local = NumberConstants::NaN;
    }
  }
  return x_local;
}

Assistant:

double JavascriptNumber::DirectPow(double x, double y)
    {
        if(y == 1.0)
        {
            return x;
        }

        // For AMD64/ARM calling convention already uses SSE2/VFP registers so we don't have to use assembler.
        // We can't just use "if (0 == y)" because NaN compares
        // equal to 0 according to our compilers.
        int32 intY;
        if (0 == NumberUtilities::LuLoDbl(y) && 0 == (NumberUtilities::LuHiDbl(y) & 0x7FFFFFFF))
        {
            // pow(x, 0) = 1 even if x is NaN.
            return 1;
        }
        else if (1.0 == fabs(x) && !NumberUtilities::IsFinite(y))
        {
            // pow([+/-] 1, Infinity) = NaN according to javascript, but not for CRT pow.
            return JavascriptNumber::NaN;
        }
        else if (TryGetInt32Value(y, &intY))
        {
            // check fast path
            return DirectPowDoubleInt(x, intY);
        }

        return ::pow(x, y);
    }